

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

uint64_t __thiscall
BamTools::Internal::BamStandardIndex::CalculateMinOffset
          (BamStandardIndex *this,BaiReferenceSummary *refSummary,uint32_t *begin)

{
  uint *in_RDX;
  BaiReferenceSummary *in_RSI;
  BamStandardIndex *in_RDI;
  int shiftedBegin;
  uint64_t local_8;
  
  if (in_RSI->NumLinearOffsets == 0) {
    local_8 = 0;
  }
  else if ((int)(*in_RDX >> 0xe) < in_RSI->NumLinearOffsets) {
    local_8 = LookupLinearOffset(in_RDI,in_RSI,(int *)in_RDX);
  }
  else {
    local_8 = LookupLinearOffset(in_RDI,in_RSI,(int *)in_RDX);
  }
  return local_8;
}

Assistant:

uint64_t BamStandardIndex::CalculateMinOffset(const BaiReferenceSummary& refSummary,
                                              const uint32_t& begin)
{
    // if no linear offsets exist, return 0
    if (refSummary.NumLinearOffsets == 0) return 0;

    // if 'begin' starts beyond last linear offset, use the last linear offset as minimum
    // else use the offset corresponding to the requested start position
    const int shiftedBegin = begin >> BamStandardIndex::BAM_LIDX_SHIFT;
    if (shiftedBegin >= refSummary.NumLinearOffsets)
        return LookupLinearOffset(refSummary, refSummary.NumLinearOffsets - 1);
    else
        return LookupLinearOffset(refSummary, shiftedBegin);
}